

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void swap_suite::run(void)

{
  swap_null();
  swap_boolean();
  swap_integer();
  swap_real();
  swap_string();
  swap_wstring();
  swap_u16string();
  swap_array();
  swap_map();
  return;
}

Assistant:

void run()
{
    swap_null();
    swap_boolean();
    swap_integer();
    swap_real();
    swap_string();
    swap_wstring();
    swap_u16string();
    swap_array();
    swap_map();
}